

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,unsigned_long *i)

{
  QTextStreamPrivate *pQVar1;
  bool bVar2;
  NumberParsingStatus NVar3;
  long in_FS_OFFSET;
  qulonglong tmp;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    operator>>((QTextStream *)pQVar1);
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    NVar3 = QTextStreamPrivate::getNumber(pQVar1,(qulonglong *)&local_20);
    if (NVar3 - npsMissingDigit < 2) {
      *i = 0;
      bVar2 = atEnd(this);
      pQVar1 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
      if (pQVar1->status == Ok) {
        pQVar1->status = ReadCorruptData - bVar2;
      }
    }
    else if (NVar3 == npsOk) {
      *i = (unsigned_long)local_20;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(unsigned long &i)
{
    IMPLEMENT_STREAM_RIGHT_INT_OPERATOR(unsigned long);
}